

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PCI.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::CutFab>::PC_local_cpu
          (FabArray<amrex::CutFab> *this,CPC *thecpc,FabArray<amrex::CutFab> *src,int scomp,
          int dcomp,int ncomp,CpOp op)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  pointer this_00;
  size_type sVar4;
  type pvVar5;
  reference pvVar6;
  FabArrayBase *in_RDX;
  byte *in_RSI;
  FabArrayBase *in_RDI;
  undefined4 in_R9D;
  int in_stack_00000008;
  Dim3 offset_1;
  Array4<const_double> sfab_2;
  FabCopyTag<amrex::CutFab> *tag_3;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
  *__range5_1;
  Dim3 offset;
  Array4<const_double> sfab_1;
  FabCopyTag<amrex::CutFab> *tag_2;
  const_iterator __end0;
  const_iterator __begin0;
  Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
  *__range5;
  Array4<double> dfab_1;
  Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_> *tags
  ;
  MFIter mfi;
  CopyComTag *tag_1;
  int i_1;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
  loc_copy_tags;
  CutFab *dfab;
  CutFab *sfab;
  CopyComTag *tag;
  int i;
  bool is_thread_safe;
  int N_locs;
  undefined4 in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  FabArray<amrex::CutFab> *in_stack_fffffffffffff890;
  FabArray<amrex::CutFab> *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  BoxArray *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  FabArrayBase *in_stack_fffffffffffff8b8;
  MFIter *in_stack_fffffffffffff8c0;
  anon_class_152_5_ce3dc6ec *in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8e4;
  Box *in_stack_fffffffffffff8e8;
  undefined1 auStack_6e0 [64];
  undefined8 local_6a0;
  int local_698;
  undefined8 local_690;
  int local_688;
  undefined8 local_67c;
  int local_674;
  Array4<const_double> local_670;
  reference local_630;
  FabCopyTag<amrex::CutFab> *local_628;
  __normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
  local_620;
  Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
  *local_618;
  undefined1 local_610 [56];
  int in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  Box *in_stack_fffffffffffffa38;
  BaseFab<double> *in_stack_fffffffffffffa40;
  BaseFab<double> *in_stack_fffffffffffffa48;
  Array4<const_double> local_558;
  reference local_518;
  FabCopyTag<amrex::CutFab> *local_510;
  __normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
  local_508;
  Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
  *local_500;
  undefined1 local_4f8 [64];
  Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
  *local_4b8;
  MFIter local_4b0;
  int local_440 [2];
  int local_438;
  CutFab *local_430;
  undefined8 uStack_428;
  undefined4 uStack_420;
  undefined4 local_41c;
  undefined4 uStack_418;
  undefined8 uStack_414;
  int local_40c [2];
  int local_404;
  reference local_400;
  int local_3f4;
  int in_stack_fffffffffffffcf0;
  int local_2c8;
  IntVect local_278;
  undefined4 local_26c;
  IntVect *local_268;
  undefined4 local_25c;
  IntVect *local_258;
  undefined4 local_24c;
  IntVect *local_248;
  CutFab *local_240;
  Dim3 local_238;
  Dim3 local_228;
  Dim3 local_218;
  Dim3 local_208;
  int local_1fc;
  Box *local_1f8;
  double *local_1f0;
  Dim3 local_1e8;
  Box *local_1d8;
  int local_1d0;
  int iStack_1cc;
  int local_1c8;
  undefined4 local_1c4;
  Box *local_1c0;
  undefined4 local_1b4;
  Box *local_1b0;
  undefined4 local_1a4;
  Box *local_1a0;
  Dim3 local_198;
  Box *local_188;
  int local_180;
  int iStack_17c;
  int local_178;
  undefined4 local_174;
  IntVect *local_170;
  undefined4 local_164;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  CutFab *local_148;
  Dim3 local_140;
  Dim3 local_130;
  Dim3 local_120;
  Dim3 local_110;
  int local_104;
  Box *local_100;
  double *local_f8;
  Dim3 local_f0;
  Box *local_e0;
  int local_d8;
  int iStack_d4;
  int local_d0;
  undefined4 local_cc;
  Box *local_c8;
  undefined4 local_bc;
  Box *local_b8;
  undefined4 local_ac;
  Box *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined8 local_50;
  int local_48;
  IntVect *local_40;
  int local_34;
  int iStack_30;
  int local_2c;
  undefined8 local_28;
  int local_20;
  IntVect *local_18;
  int local_c;
  int iStack_8;
  int local_4;
  
  this_00 = std::
            unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
            ::operator->((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                          *)0x141fedb);
  sVar4 = std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::size(this_00);
  iVar3 = (int)sVar4;
  if (iVar3 != 0) {
    if ((*in_RSI & 1) == 0) {
      FabArrayBase::boxArray(in_RDI);
      FabArrayBase::DistributionMap(in_RDI);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
      ::LayoutData((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                   in_stack_fffffffffffff8a8,
                   (DistributionMapping *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      for (local_3f4 = 0; local_3f4 < iVar3; local_3f4 = local_3f4 + 1) {
        pvVar5 = std::
                 unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 ::operator*((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              *)in_stack_fffffffffffff890);
        local_400 = std::
                    vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    ::operator[](pvVar5,(long)local_3f4);
        if (((in_RDI != in_RDX) || (local_400->dstIndex != local_400->srcIndex)) ||
           (bVar2 = Box::operator!=((Box *)in_stack_fffffffffffff890,
                                    (Box *)CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888)), bVar2)) {
          in_stack_fffffffffffff8c0 =
               (MFIter *)
               LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
               ::operator[]((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                             *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          local_430 = fabPtr(in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          uStack_428 = *(undefined8 *)(local_400->dbox).smallend.vect;
          uVar1 = *(undefined8 *)((local_400->dbox).smallend.vect + 2);
          uStack_414 = *(undefined8 *)((local_400->dbox).bigend.vect + 2);
          uStack_418 = (undefined4)((ulong)*(undefined8 *)(local_400->dbox).bigend.vect >> 0x20);
          uStack_420 = (undefined4)uVar1;
          local_41c = (undefined4)((ulong)uVar1 >> 0x20);
          in_stack_fffffffffffff8b8 = (FabArrayBase *)Box::smallEnd(&local_400->sbox);
          local_268 = Box::smallEnd(&local_400->dbox);
          local_24c = 0;
          local_25c = 1;
          local_26c = 2;
          local_258 = local_268;
          local_248 = local_268;
          IntVect::IntVect(&local_278,
                           *(int *)&in_stack_fffffffffffff8b8->_vptr_FabArrayBase -
                           local_268->vect[0],
                           *(int *)((long)&in_stack_fffffffffffff8b8->_vptr_FabArrayBase + 4) -
                           local_268->vect[1],
                           (in_stack_fffffffffffff8b8->boxarray).m_bat.m_bat_type -
                           local_268->vect[2]);
          local_438 = local_278.vect[2];
          local_440[0] = local_278.vect[0];
          local_440[1] = local_278.vect[1];
          local_404 = local_278.vect[2];
          local_40c[0] = local_278.vect[0];
          local_40c[1] = local_278.vect[1];
          std::
          vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
          ::push_back((vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                       *)in_stack_fffffffffffff890,
                      (value_type *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
      }
      MFIter::MFIter(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                     (uchar)((uint)in_stack_fffffffffffff8b4 >> 0x18));
      while (bVar2 = MFIter::isValid(&local_4b0), bVar2) {
        local_4b8 = LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                    ::operator[]((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                                  *)in_stack_fffffffffffff890,
                                 (MFIter *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        array<amrex::CutFab,_0>(in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
        if (in_stack_00000008 == 0) {
          local_500 = local_4b8;
          local_508._M_current =
               (FabCopyTag<amrex::CutFab> *)
               std::
               vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
               ::begin((vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                        *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          local_510 = (FabCopyTag<amrex::CutFab> *)
                      std::
                      vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                      ::end((vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                             *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                                     *)in_stack_fffffffffffff890,
                                    (__normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                   ), bVar2) {
            local_518 = __gnu_cxx::
                        __normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                        ::operator*(&local_508);
            local_148 = local_518->sfab;
            local_f8 = (local_148->super_FArrayBox).super_BaseFab<double>.dptr;
            local_100 = &(local_148->super_FArrayBox).super_BaseFab<double>.domain;
            local_104 = (local_148->super_FArrayBox).super_BaseFab<double>.nvar;
            local_ac = 0;
            local_d8 = (local_100->smallend).vect[0];
            local_bc = 1;
            iStack_d4 = (local_148->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1];
            local_120.x = (local_100->smallend).vect[0];
            local_120.y = (local_100->smallend).vect[1];
            local_cc = 2;
            local_120.z = (local_148->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2]
            ;
            local_58 = &(local_148->super_FArrayBox).super_BaseFab<double>.domain.bigend;
            local_5c = 0;
            local_88 = local_58->vect[0] + 1;
            local_68 = &(local_148->super_FArrayBox).super_BaseFab<double>.domain.bigend;
            local_6c = 1;
            iStack_84 = (local_148->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] + 1
            ;
            local_78 = &(local_148->super_FArrayBox).super_BaseFab<double>.domain.bigend;
            local_7c = 2;
            local_140.z = (local_148->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] +
                          1;
            local_140.y = iStack_84;
            local_140.x = local_88;
            local_130._0_8_ = local_140._0_8_;
            local_130.z = local_140.z;
            local_110._0_8_ = local_120._0_8_;
            local_110.z = local_120.z;
            local_f0._0_8_ = local_120._0_8_;
            local_f0.z = local_120.z;
            local_e0 = local_100;
            local_d0 = local_120.z;
            local_c8 = local_100;
            local_b8 = local_100;
            local_a8 = local_100;
            local_a0._0_8_ = local_140._0_8_;
            local_a0.z = local_140.z;
            local_90 = local_100;
            local_80 = local_140.z;
            Array4<const_double>::Array4(&local_558,local_f8,&local_110,&local_130,local_104);
            local_18 = &local_518->offset;
            local_c = local_18->vect[0];
            iStack_8 = (local_518->offset).vect[1];
            local_28 = *(undefined8 *)local_18->vect;
            local_20 = (local_518->offset).vect[2];
            local_4 = local_20;
            memcpy(local_610,local_4f8,0x3c);
            memcpy(&stack0xfffffffffffffa38,&local_558,0x3c);
            LoopConcurrentOnCpu<amrex::FabArray<amrex::CutFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::CutFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_1_>
                      (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4,in_stack_fffffffffffff8d8
                      );
            __gnu_cxx::
            __normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
            ::operator++(&local_508);
          }
        }
        else {
          local_618 = local_4b8;
          local_620._M_current =
               (FabCopyTag<amrex::CutFab> *)
               std::
               vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
               ::begin((vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                        *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          local_628 = (FabCopyTag<amrex::CutFab> *)
                      std::
                      vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                      ::end((vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                             *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                                     *)in_stack_fffffffffffff890,
                                    (__normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                   ), bVar2) {
            local_630 = __gnu_cxx::
                        __normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                        ::operator*(&local_620);
            local_240 = local_630->sfab;
            local_1f0 = (local_240->super_FArrayBox).super_BaseFab<double>.dptr;
            local_1f8 = &(local_240->super_FArrayBox).super_BaseFab<double>.domain;
            local_1fc = (local_240->super_FArrayBox).super_BaseFab<double>.nvar;
            local_1a4 = 0;
            local_1d0 = (local_1f8->smallend).vect[0];
            local_1b4 = 1;
            iStack_1cc = (local_240->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1];
            local_218.x = (local_1f8->smallend).vect[0];
            local_218.y = (local_1f8->smallend).vect[1];
            local_1c4 = 2;
            local_218.z = (local_240->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2]
            ;
            local_150 = &(local_240->super_FArrayBox).super_BaseFab<double>.domain.bigend;
            local_154 = 0;
            local_180 = local_150->vect[0] + 1;
            local_160 = &(local_240->super_FArrayBox).super_BaseFab<double>.domain.bigend;
            local_164 = 1;
            iStack_17c = (local_240->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] +
                         1;
            local_170 = &(local_240->super_FArrayBox).super_BaseFab<double>.domain.bigend;
            local_174 = 2;
            local_238.z = (local_240->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] +
                          1;
            local_238.y = iStack_17c;
            local_238.x = local_180;
            local_228._0_8_ = local_238._0_8_;
            local_228.z = local_238.z;
            local_208._0_8_ = local_218._0_8_;
            local_208.z = local_218.z;
            local_1e8._0_8_ = local_218._0_8_;
            local_1e8.z = local_218.z;
            local_1d8 = local_1f8;
            local_1c8 = local_218.z;
            local_1c0 = local_1f8;
            local_1b0 = local_1f8;
            local_1a0 = local_1f8;
            local_198._0_8_ = local_238._0_8_;
            local_198.z = local_238.z;
            local_188 = local_1f8;
            local_178 = local_238.z;
            Array4<const_double>::Array4(&local_670,local_1f0,&local_208,&local_228,local_1fc);
            local_40 = &local_630->offset;
            local_34 = local_40->vect[0];
            iStack_30 = (local_630->offset).vect[1];
            local_690 = *(undefined8 *)local_40->vect;
            local_688 = (local_630->offset).vect[2];
            in_stack_fffffffffffff898 = (FabArray<amrex::CutFab> *)&local_630->dbox;
            local_67c = local_690;
            local_674 = local_688;
            local_50 = local_690;
            local_48 = local_688;
            local_2c = local_688;
            memcpy(&stack0xfffffffffffff8d8,local_4f8,0x3c);
            memcpy(auStack_6e0,&local_670,0x3c);
            local_6a0 = local_67c;
            local_698 = local_674;
            LoopConcurrentOnCpu<amrex::FabArray<amrex::CutFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::CutFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_2_>
                      (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4,in_stack_fffffffffffff8d8
                      );
            __gnu_cxx::
            __normal_iterator<const_amrex::FabCopyTag<amrex::CutFab>_*,_std::vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
            ::operator++(&local_620);
          }
        }
        MFIter::operator++(&local_4b0);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffff890);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
      ::~LayoutData((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
                     *)in_stack_fffffffffffff890);
    }
    else {
      for (local_2c8 = 0; local_2c8 < iVar3; local_2c8 = local_2c8 + 1) {
        pvVar5 = std::
                 unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 ::operator*((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              *)in_stack_fffffffffffff890);
        pvVar6 = std::
                 vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                 ::operator[](pvVar5,(long)local_2c8);
        if (((in_RDI != in_RDX) || (pvVar6->dstIndex != pvVar6->srcIndex)) ||
           (bVar2 = Box::operator!=((Box *)in_stack_fffffffffffff890,
                                    (Box *)CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888)), bVar2)) {
          operator[](in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          get(in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          in_stack_fffffffffffff888 = in_R9D;
          if (in_stack_00000008 == 0) {
            CutFab::copy<(amrex::RunOn)1>
                      ((CutFab *)in_stack_fffffffffffff8c0,(CutFab *)in_stack_fffffffffffff8b8,
                       (Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                       (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                       (Box *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       (int)((ulong)in_stack_fffffffffffff898 >> 0x20),(int)in_RDI);
          }
          else {
            BaseFab<double>::plus<(amrex::RunOn)1>
                      (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
                       ,(Box *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                       in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28,in_stack_fffffffffffffcf0
                      );
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::PC_local_cpu (const CPC& thecpc, FabArray<FAB> const& src,
                             int scomp, int dcomp, int ncomp, CpOp op)
{
    int N_locs = thecpc.m_LocTags->size();
    if (N_locs == 0) return;
    bool is_thread_safe = thecpc.m_threadsafe_loc;

    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                // avoid self copy or plus
                const FAB* sfab = &(src[tag.srcIndex]);
                      FAB* dfab = &(get(tag.dstIndex));
                if (op == FabArrayBase::COPY)
                {
                    dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, dcomp, ncomp);
                }
                else
                {
                    dfab->template plus<RunOn::Host>(*sfab, tag.sbox, tag.dbox, scomp, dcomp, ncomp);
                }
            }
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                loc_copy_tags[tag.dstIndex].push_back
                    ({src.fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            if (op == FabArrayBase::COPY)
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) = sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
            else
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) += sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
        }
    }
}